

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.c
# Opt level: O0

int strstart(char *str,char *val,char **ptr)

{
  char *q;
  char *p;
  char **ptr_local;
  char *val_local;
  char *str_local;
  
  q = val;
  p = str;
  while( true ) {
    if (*q == '\0') {
      if (ptr != (char **)0x0) {
        *ptr = p;
      }
      return 1;
    }
    if (*p != *q) break;
    p = p + 1;
    q = q + 1;
  }
  return 0;
}

Assistant:

int strstart(const char *str, const char *val, const char **ptr)
{
    const char *p, *q;
    p = str;
    q = val;
    while (*q != '\0') {
        if (*p != *q)
            return 0;
        p++;
        q++;
    }
    if (ptr)
        *ptr = p;
    return 1;
}